

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.h
# Opt level: O0

void __thiscall
Js::AutoInitLibraryCodeScope::~AutoInitLibraryCodeScope(AutoInitLibraryCodeScope *this)

{
  ThreadContext *this_00;
  AutoInitLibraryCodeScope *this_local;
  
  this_00 = ScriptContext::GetThreadContext(this->scriptContext);
  ThreadContext::SetIsProfilingUserCode(this_00,(bool)(this->oldIsProfilingUserCode & 1));
  ScriptContext::SetIsDebuggerRecording
            (this->scriptContext,(bool)(this->oldIsDebuggerRecording & 1));
  return;
}

Assistant:

~AutoInitLibraryCodeScope()
        {
            this->scriptContext->GetThreadContext()->SetIsProfilingUserCode(this->oldIsProfilingUserCode);
            this->scriptContext->SetIsDebuggerRecording(this->oldIsDebuggerRecording);
        }